

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall BayesianGameForDecPOMDPStage::Initialize(BayesianGameForDecPOMDPStage *this)

{
  long lVar1;
  code *pcVar2;
  QFunctionJAOHInterface *pQVar3;
  bool bVar4;
  byte bVar5;
  Index ts_00;
  ostream *this_00;
  JointBeliefInterface *pJVar6;
  reference ppJVar7;
  undefined8 uVar8;
  ulong uVar9;
  size_t sVar10;
  size_type *psVar11;
  shared_ptr<const_PartialJointPolicyDiscretePure> sVar12;
  size_type asStackY_200 [2];
  BayesianGameForDecPOMDPStageInterface *in_stack_fffffffffffffe18;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  Index ts_01;
  BayesianGameForDecPOMDPStage *in_stack_fffffffffffffe40;
  undefined8 uStack_1b8;
  double local_1b0;
  undefined8 uStack_1a8;
  size_type local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  Index in_stack_fffffffffffffe74;
  BayesianGameBase *in_stack_fffffffffffffe78;
  undefined8 local_168;
  size_type local_160 [3];
  Index IStack_144;
  size_type local_140 [2];
  LIndex local_130;
  double ut;
  Index jaI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> joI_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jaI_vec;
  JointBeliefInterface *jb;
  double PjaohI;
  Index jaohI;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  undefined1 local_a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indTypes;
  Index jtI;
  BayesianGameIdenticalPayoff *bg_ts;
  undefined1 local_70 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> firstOHtsI;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  shared_ptr<const_JointPolicyDiscretePure> jpolPrevTs;
  size_t nrJOHts;
  Index ts;
  BayesianGameForDecPOMDPStage *this_local;
  
  ts_01 = (Index)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  ts_00 = BayesianGameForDecPOMDPStageInterface::GetStage
                    (&this->super_BayesianGameForDecPOMDPStageInterface);
  BayesianGameForDecPOMDPStageInterface::GetPastJointPolicy(in_stack_fffffffffffffe18);
  bVar4 = boost::operator==((shared_ptr<const_PartialJointPolicyDiscretePure> *)
                            in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x8b584e);
  if (bVar4) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Warning Initialize called without past joint policy: aborting.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else {
    jpolPrevTs.pn.pi_ =
         (sp_counted_base *)
         PlanningUnitMADPDiscrete::GetNrJointObservationHistories
                   (in_stack_fffffffffffffe20,(Index)((ulong)in_stack_fffffffffffffe18 >> 0x20));
    sVar12 = BayesianGameForDecPOMDPStageInterface::GetPastJointPolicy(in_stack_fffffffffffffe18);
    boost::shared_ptr<JointPolicyDiscretePure_const>::
    shared_ptr<PartialJointPolicyDiscretePure_const>
              ((shared_ptr<const_JointPolicyDiscretePure> *)local_40,local_50,sVar12.pn.pi_.pi_);
    boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x8b58ce);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8b58de);
    Fill_FirstOHtsI(in_stack_fffffffffffffe40,ts_01,in_stack_fffffffffffffe30);
    for (indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        (sp_counted_base *)
        (ulong)indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ < jpolPrevTs.pn.pi_;
        indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             indTypes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      BayesianGameBase::JointToIndividualTypeIndices
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe74);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 in_stack_fffffffffffffe68);
      lVar1 = -((ulong)ts_00 * 4 + 0xf & 0xfffffffffffffff0);
      *(undefined8 *)(&stack0xfffffffffffffe10 + lVar1) = 0x8b5996;
      Fill_joI_Array(this,ts_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,
                     (Index *)(&stack0xfffffffffffffe18 + lVar1));
      psVar11 = (size_type *)
                ((long)(&stack0xfffffffffffffe18 + lVar1) -
                ((ulong)ts_00 * 4 + 0xf & 0xfffffffffffffff0));
      psVar11[-1] = 0x8b59de;
      boost::shared_ptr<const_JointPolicyDiscretePure>::shared_ptr
                ((shared_ptr<const_JointPolicyDiscretePure> *)psVar11[1],
                 (shared_ptr<const_JointPolicyDiscretePure> *)*psVar11);
      psVar11[-1] = 0x8b5a05;
      Fill_jaI_Array((BayesianGameForDecPOMDPStage *)psVar11[7],*(Index *)((long)psVar11 + 0x34),
                     (Index *)psVar11[5],(shared_ptr<const_JointPolicyDiscretePure> *)psVar11[4],
                     (Index *)psVar11[3]);
      psVar11[-1] = 0x8b5a13;
      boost::shared_ptr<const_JointPolicyDiscretePure>::~shared_ptr
                ((shared_ptr<const_JointPolicyDiscretePure> *)psVar11[-1]);
      PjaohI._4_4_ = 0;
      jb = (JointBeliefInterface *)0x3ff0000000000000;
      psVar11[-1] = 0x8b5a41;
      pJVar6 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD
                         ((PlanningUnitMADPDiscrete *)psVar11[3]);
      if (ts_00 != 0) {
        psVar11[-1] = 0x8b5a8a;
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)psVar11[-1]);
        psVar11[-1] = 0x8b5aab;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)psVar11[9],
                   (uint *)psVar11[8],(uint *)psVar11[7],(allocator_type *)psVar11[6]);
        psVar11[-1] = 0x8b5ab9;
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)psVar11[-1]);
        psVar11[-1] = 0x8b5ae1;
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)psVar11[-1]);
        psVar11[-1] = 0x8b5b02;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)psVar11[9],
                   (uint *)psVar11[8],(uint *)psVar11[7],(allocator_type *)psVar11[6]);
        psVar11[-1] = 0x8b5b10;
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)psVar11[-1]);
        psVar11[-1] = 0x8b5b34;
        PjaohI._4_4_ = PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex
                                 ((PlanningUnitMADPDiscrete *)psVar11[0x15],
                                  *(Index *)((long)psVar11 + 0xa4),
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  psVar11[0x13],
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  psVar11[0x12]);
        psVar11[-1] = 0;
        psVar11[-2] = 0;
        psVar11[-3] = 0x8b5b8d;
        jb = (JointBeliefInterface *)
             PlanningUnitMADPDiscrete::GetJAOHProbsRecursively
                       ((PlanningUnitMADPDiscrete *)psVar11[0x14],
                        (JointBeliefInterface *)psVar11[0x13],(Index *)psVar11[0x12],
                        (Index *)psVar11[0x11],*(Index *)((long)psVar11 + 0x84),(Index)psVar11[0x10]
                        ,psVar11[0x17],(JointPolicyDiscrete *)psVar11[0x18]);
        psVar11[-1] = 0x8b5bb7;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)psVar11[3]);
        psVar11[-1] = 0x8b5bc3;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)psVar11[3]);
      }
      if (0.0 < (double)jb) {
        lVar1 = *(long *)((long)*pJVar6 + -0xb8);
        pcVar2 = *(code **)(*(long *)(&pJVar6->field_0x0 + lVar1) + 0x78);
        psVar11[-1] = 0x8b5c9e;
        bVar5 = (*pcVar2)(&pJVar6->field_0x0 + lVar1);
        if ((bVar5 & 1) == 0) {
          psVar11[-1] = 0x8b5d01;
          uVar8 = __cxa_allocate_exception(0x28);
          psVar11[-1] = 0x8b5d1a;
          E::E((E *)psVar11[7],(char *)psVar11[6]);
          psVar11[-1] = (size_type)&LAB_008b5d36;
          __cxa_throw(uVar8,&E::typeinfo,E::~E);
        }
        psVar11[-1] = 0x8b5cdb;
        ppJVar7 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                              *)psVar11[1],*psVar11);
        *ppJVar7 = pJVar6;
      }
      psVar11[-1] = 0x8b5d71;
      BayesianGameBase::SetProbability
                ((BayesianGameBase *)psVar11[9],*(Index *)((long)psVar11 + 0x44),(double)psVar11[7])
      ;
      ut._0_4_ = 0;
      while( true ) {
        uVar9 = (ulong)ut._0_4_;
        psVar11[-1] = 0x8b5d9a;
        sVar10 = BayesianGameBase::GetNrJointActions((BayesianGameBase *)psVar11[3]);
        if (sVar10 <= uVar9) break;
        if ((double)jb <= 0.0) {
          psVar11[-1] = 0x8b5e43;
          BayesianGameIdenticalPayoff::SetUtility
                    ((BayesianGameIdenticalPayoff *)psVar11[1],*(Index *)((long)psVar11 + 4),
                     (Index)*psVar11,(double)psVar11[-1]);
        }
        else {
          pQVar3 = this->_m_qHeuristic;
          pcVar2 = *(code **)((long)*pQVar3 + 0x68);
          psVar11[-1] = 0x8b5def;
          (*pcVar2)(pQVar3,PjaohI._4_4_,ut._0_4_);
          psVar11[-1] = 0x8b5e26;
          BayesianGameIdenticalPayoff::SetUtility
                    ((BayesianGameIdenticalPayoff *)psVar11[1],*(Index *)((long)psVar11 + 4),
                     (Index)*psVar11,(double)psVar11[-1]);
        }
        ut._0_4_ = ut._0_4_ + 1;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe30);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffe30);
    boost::shared_ptr<const_JointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<const_JointPolicyDiscretePure> *)0x8b5ea7);
  }
  return;
}

Assistant:

void BayesianGameForDecPOMDPStage::Initialize()
{
    //stringstream ss;
    //ss << "GMAA::ConstructBG_ts" << depth;
    //_m_pu->StartTimer(ss.str());

    Index ts = GetStage();
    if(GetPastJointPolicy() == 0)
    {
        cerr << "Warning Initialize called without past joint policy: aborting."
            <<endl;
        return;
    }

    if(DEBUG_BG4DECPOMDP1)
        cout << ">>>BayesianGameForDecPOMDPStage::Initialize() called for"
             << " ts=" << ts << endl;
    if(DEBUG_BG4DECPOMDP2)
        cout <<" - previous policy: " << GetPastJointPolicy()->SoftPrintBrief() << endl;

    size_t nrJOHts = _m_pu->GetNrJointObservationHistories(ts);
    boost::shared_ptr<const JointPolicyDiscretePure> jpolPrevTs = GetPastJointPolicy();

    //stores the indices of the first OH for time step ts for each agent
    vector<Index> firstOHtsI;
    Fill_FirstOHtsI(ts, firstOHtsI);
    
    //the expected reward for time-steps 0...ts-1
    //this will be calculated as Sum_jaoh P(jaoh) R_{0...ts-1}(jaoh)
    //double ExpR_0_prevTS = 0.0;


    BayesianGameIdenticalPayoff *bg_ts=this;
    //for each joint obs. history (type of the BG), we determine the actions
    //that jpolPrevTs would have specified (i.e., we determine JAOH, the 
    //act-obs. history). This is then used to compute:
    //  -the probability of this joint obs. history (given jpolPrevTs)
    //  -the expected reward over 0...ts-1 GIVEN that this JAOH occurs
    for(Index jtI = 0; jtI < nrJOHts; jtI++)
    {
        if(DEBUG_BG4DECPOMDP2)
            PrintProgress("jtI",jtI,nrJOHts, 10);
        
        //we loop over Joint Type indices - these correspond to 
        //joint observation history indices, but non-trivially, so let's first
        //compute the joint observation history 
        const vector<Index> indTypes = bg_ts->JointToIndividualTypeIndices(jtI);

        //array for the joint observations at ts=1,...,ts
        Index joI_arr[ts];
        Fill_joI_Array(ts, indTypes, firstOHtsI, joI_arr);

        //we don't want to be dependent on the generation of joint
        //observation histories
        //const JointObservationHistoryTree* joht = Get_joht(ts, joI_arr);
        //Index johI = _m_pu->GetJointObservationHistoryIndex(ts, joI_arr);

        //see what joint action-observation history corresponds to 
        // previous policy jpolPrevTs

        //first get all actions taken
        Index jaI_arr[ts];//the taken joint actions at t=0,...,ts-1
        Fill_jaI_Array(ts, joI_arr, jpolPrevTs, jaI_arr);
        //now we know the taken actions and the observation history, so we 
        //can reconstruct the joint action-observation history and its 
        //probability.

        //the cumulative reward over 0...ts-1 GIVEN that this JAOH occurs.
        //double ExpR_0_prevTS_thisJAOH = 0.0;
        //get the joah Index and corresponding reward and prob.
        //new:
        Index jaohI = 0;
        double PjaohI = 1.0;
        JointBeliefInterface* jb = _m_pu->GetNewJointBeliefFromISD();
        if(ts > 0)
        {
            vector< Index > jaI_vec(&jaI_arr[0],&jaI_arr[ts]);
            vector< Index > joI_vec(&joI_arr[0],&joI_arr[ts]);
            jaohI = _m_pu->GetJointActionObservationHistoryIndex(ts, jaI_vec, 
                    joI_vec);
            PjaohI = _m_pu->GetJAOHProbsRecursively(jb, jaI_arr, joI_arr, 0,ts);
        }
        if(PjaohI>0)
        {
            if(jb->SanityCheck())
                _m_JBs.at(jtI) = jb;
            else
                throw(E("BayesianGameForDecPOMDPStage::Initialize() joint belief not valid"));
        }

/*        //old:
        ProbRewardForjoahI(ts, jtI, jaI_arr,joI_arr, jaohI, PjaohI, 
              ExpR_0_prevTS_thisJAOH );
        ExpR_0_prevTS += ExpR_0_prevTS_thisJAOH * PjaohI;
*/

        //now we have found the jaohI corresponding to johI (jtI) and 
        //previous policy jpolPrevTs, so we can get the Q-value and prob. for 
        //the BG.
        bg_ts->SetProbability(jtI, PjaohI);
        for(Index jaI=0; jaI < GetNrJointActions(); jaI++)
        {
            if(PjaohI>0) // asking for a heuristic Q for a history
                         // that cannot have occurred might lead to
                         // problems (QMDP cannot compute a belief for
                         // instance, so just put 0
            {
                double ut = _m_qHeuristic->GetQ(jaohI, jaI);
                bg_ts->SetUtility(jtI, jaI, ut );
            }
            else
                bg_ts->SetUtility(jtI, jaI, 0);
        }
    
    }//end for jtI
    //now the Bayesian game is constructed completely.

    //perhaps store the previous reward somewhere?
    //_m_pastReward = ExpR_0_prevTS;
}